

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

string * Util::writeXmlAttribute<bool>
                   (string *__return_storage_ptr__,stringstream *str,string *attr,bool value)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)(str + 0x10)," ");
  poVar1 = std::operator<<(poVar1,(string *)attr);
  poVar1 = std::operator<<(poVar1,"=\"");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::operator<<(poVar1,"\"");
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

static std::string writeXmlAttribute(std::stringstream &str, std::string attr, T value)
	{
		str << " " << attr << "=\"" << value << "\"";
		return str.str();
	}